

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

bool __thiscall
DNSResolve::EncodeDotStr(DNSResolve *this,char *dot_str,char *encoded_str,size_t encoded_str_size)

{
  size_t sVar1;
  char *__dest;
  long local_58;
  size_t encoded_str_len;
  size_t label_len;
  char *label;
  char *dot_str_copy;
  size_t dot_str_len;
  size_t encoded_str_size_local;
  char *encoded_str_local;
  char *dot_str_local;
  DNSResolve *this_local;
  
  sVar1 = strlen(dot_str);
  if (((dot_str == (char *)0x0) || (encoded_str == (char *)0x0)) || (encoded_str_size < sVar1 + 2))
  {
    this_local._7_1_ = false;
  }
  else {
    __dest = (char *)operator_new__(sVar1 + 1);
    strcpy(__dest,dot_str);
    label_len = (size_t)strtok(__dest,".");
    local_58 = 0;
    while (label_len != 0) {
      sVar1 = strlen((char *)label_len);
      if (sVar1 != 0) {
        sprintf(encoded_str + local_58,"%c%s",sVar1 & 0xffffffff,label_len);
        local_58 = sVar1 + 1 + local_58;
      }
      label_len = (size_t)strtok((char *)0x0,".");
    }
    if (__dest != (char *)0x0) {
      operator_delete(__dest);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DNSResolve::EncodeDotStr(const char* dot_str, char *encoded_str, size_t encoded_str_size)
{
    size_t dot_str_len = strlen(dot_str);

    if (dot_str == NULL || encoded_str == NULL || encoded_str_size < dot_str_len + 2)
    {
        return false;
    }

    char *dot_str_copy = new char[dot_str_len + 1];
    strcpy(dot_str_copy, dot_str);

    char *label = strtok(dot_str_copy, ".");
    size_t label_len = 0;
    size_t encoded_str_len = 0;
    while (label != NULL)
    {
        if ((label_len = strlen(label)) != 0)
        {
            sprintf(encoded_str + encoded_str_len, "%c%s", (int)label_len, label);
            encoded_str_len += (label_len + 1);
        }
        label = strtok(NULL, ".");
    }
    delete dot_str_copy;
    return true;
}